

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::optimize
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this)

{
  Expression *pEVar1;
  LocalSet *set;
  bool bVar2;
  mapped_type *pmVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  LocalGet *pLVar7;
  LocalGet *local_30;
  LocalGet *get;
  
  pEVar1 = this->curr->ptr;
  if (pEVar1->_id == BinaryId) {
    if ((pEVar1[1]._id == AtomicCmpxchgId) || (pEVar1[1]._id == InvalidId)) {
      bVar2 = tryToOptimizeConstant
                        (this,*(Expression **)(pEVar1 + 2),(Expression *)pEVar1[1].type.id);
      if (bVar2) {
        return false;
      }
      bVar2 = tryToOptimizeConstant
                        (this,(Expression *)pEVar1[1].type.id,*(Expression **)(pEVar1 + 2));
      if (bVar2) {
        return false;
      }
    }
  }
  else if (pEVar1->_id == ConstId) {
    optimizeConstantPointer(this);
    return false;
  }
  if (this->localGraph == (LocalGraph *)0x0) {
    return false;
  }
  local_30 = (LocalGet *)this->curr->ptr;
  pLVar7 = (LocalGet *)0x0;
  if ((local_30->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
      LocalGetId) {
    local_30 = pLVar7;
  }
  if (local_30 != (LocalGet *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this->localGraph,&local_30);
    p_Var6 = (_Base_ptr)
             (pmVar3->
             super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var5 = p_Var6;
    if (p_Var6 == (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               (pmVar3->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
               ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var5 == (_Base_ptr)0x1) {
      p_Var5 = p_Var6;
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var5 = (pmVar3->
                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var5 = p_Var5 + 1;
      if (p_Var6 == (_Base_ptr)0x0) {
        p_Var5 = (_Base_ptr)
                 &(pmVar3->
                  super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
      }
      set = *(LocalSet **)p_Var5;
      if (set != (LocalSet *)0x0) {
        p_Var4 = &(this->parent->propagatable)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (this->parent->propagatable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        p_Var5 = &p_Var4->_M_header;
        for (; p_Var6 != (_Base_ptr)0x0;
            p_Var6 = (&p_Var6->_M_left)[*(LocalSet **)(p_Var6 + 1) < set]) {
          if (*(LocalSet **)(p_Var6 + 1) >= set) {
            p_Var5 = p_Var6;
          }
        }
        p_Var6 = &p_Var4->_M_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var4) &&
           (p_Var6 = p_Var5, set < *(LocalSet **)(p_Var5 + 1))) {
          p_Var6 = &p_Var4->_M_header;
        }
        if ((((_Rb_tree_header *)p_Var6 != p_Var4) && (pEVar1 = set->value, pEVar1->_id == BinaryId)
            ) && (pEVar1[1]._id == InvalidId)) {
          bVar2 = tryToOptimizePropagatedAdd
                            (this,*(Expression **)(pEVar1 + 2),(Expression *)pEVar1[1].type.id,
                             local_30,set);
          pLVar7 = (LocalGet *)0x1;
          if ((bVar2) ||
             (bVar2 = tryToOptimizePropagatedAdd
                                (this,(Expression *)pEVar1[1].type.id,*(Expression **)(pEVar1 + 2),
                                 local_30,set), bVar2)) goto LAB_007e0b79;
        }
      }
    }
    pLVar7 = (LocalGet *)0x0;
  }
LAB_007e0b79:
  if (SUB81(pLVar7,0) == false) {
    return false;
  }
  return SUB81(pLVar7,0);
}

Assistant:

bool optimize() {
    // The pointer itself may be a constant, if e.g. it was precomputed or
    // a get that we propagated.
    if (curr->ptr->template is<Const>()) {
      optimizeConstantPointer();
      return false;
    }
    if (auto* add = curr->ptr->template dynCast<Binary>()) {
      if (add->op == AddInt32 || add->op == AddInt64) {
        // Look for a constant on both sides.
        if (tryToOptimizeConstant(add->right, add->left) ||
            tryToOptimizeConstant(add->left, add->right)) {
          return false;
        }
      }
    }
    if (localGraph) {
      // A final important case is a propagated add:
      //
      //  x = y + 10
      //  ..
      //  load(x)
      // =>
      //  x = y + 10
      //  ..
      //  load(y, offset=10)
      //
      // This is only valid if y does not change in the middle!
      if (auto* get = curr->ptr->template dynCast<LocalGet>()) {
        auto& sets = localGraph->getSetses[get];
        if (sets.size() == 1) {
          auto* set = *sets.begin();
          // May be a zero-init (in which case, we can ignore it). Must also be
          // valid to propagate, as checked earlier in the parent.
          if (set && parent->isPropagatable(set)) {
            auto* value = set->value;
            if (auto* add = value->template dynCast<Binary>()) {
              if (add->op == AddInt32) {
                // We can optimize on either side, but only if both we find
                // a constant *and* the other side cannot change in the middle.
                // TODO If it could change, we may add a new local to capture
                //      the old value.
                if (tryToOptimizePropagatedAdd(
                      add->right, add->left, get, set) ||
                    tryToOptimizePropagatedAdd(
                      add->left, add->right, get, set)) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    return false;
  }